

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memleak.cc
# Opt level: O2

void * memleak_calloc(size_t nmemb,size_t size,char *file,size_t line)

{
  void *addr;
  
  addr = calloc(nmemb,size);
  if ((addr != (void *)0x0) && ((start_sw & 1) != 0)) {
    pthread_spin_lock(&lock);
    _memleak_add_to_index(addr,size,file,line,'\0');
    pthread_spin_unlock(&lock);
  }
  return addr;
}

Assistant:

LIBMEMLEAK_API
void * memleak_calloc(size_t nmemb, size_t size, char *file, size_t line)
{
    void *addr = (void *)calloc(nmemb, size);
    if (addr && start_sw) {
        spin_lock(&lock);
        _memleak_add_to_index(addr, size, file, line, 0x0);
        spin_unlock(&lock);
    }

    return addr;
}